

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O3

void membuf_delete(membuf **sbp)

{
  membuf *__ptr;
  void *__ptr_00;
  
  __ptr = *sbp;
  __ptr_00 = __ptr->buf;
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  *sbp = (membuf *)0x0;
  return;
}

Assistant:

void membuf_delete(struct membuf **sbp)
{
    struct membuf *sb;

    sb = *sbp;
    membuf_free(sb);
    free(sb);
    sb = NULL;
    *sbp = sb;
}